

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall
spv::Builder::makeStructType
          (Builder *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *members,char *name,
          bool compilerGenerated)

{
  int iVar1;
  Id IVar2;
  Instruction *pIVar3;
  size_type sVar4;
  const_reference pvVar5;
  mapped_type *this_00;
  mapped_type_conflict *pmVar6;
  Id local_48;
  Id local_44;
  Id debugResultId;
  key_type local_38;
  int local_34;
  Instruction *pIStack_30;
  int op;
  Instruction *type;
  char *pcStack_20;
  bool compilerGenerated_local;
  char *name_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *members_local;
  Builder *this_local;
  
  type._7_1_ = compilerGenerated;
  pcStack_20 = name;
  name_local = (char *)members;
  members_local = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)this;
  pIVar3 = (Instruction *)::operator_new(0x60);
  IVar2 = getUniqueId(this);
  spv::Instruction::Instruction(pIVar3,IVar2,0,OpTypeStruct);
  local_34 = 0;
  pIStack_30 = pIVar3;
  while( true ) {
    iVar1 = local_34;
    sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)name_local);
    pIVar3 = pIStack_30;
    if ((int)sVar4 <= iVar1) break;
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)name_local,
                        (long)local_34);
    spv::Instruction::addIdOperand(pIVar3,*pvVar5);
    local_34 = local_34 + 1;
  }
  local_38 = 0x1e;
  this_00 = std::
            unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
            ::operator[](&this->groupedTypes,&local_38);
  std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::push_back
            (this_00,&stack0xffffffffffffffd0);
  std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
  unique_ptr<std::default_delete<spv::Instruction>,void>
            ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)
             &stack0xffffffffffffffc0,pIStack_30);
  std::
  vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ::push_back(&this->constantsTypesGlobals,(value_type *)&stack0xffffffffffffffc0);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
            ((unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
             &stack0xffffffffffffffc0);
  Module::mapInstruction(&this->module,pIStack_30);
  IVar2 = spv::Instruction::getResultId(pIStack_30);
  addName(this,IVar2,pcStack_20);
  if (((this->emitNonSemanticShaderDebugInfo & 1U) != 0) && ((type._7_1_ & 1) == 0)) {
    IVar2 = makeCompositeDebugType
                      (this,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)name_local,
                       pcStack_20,NonSemanticShaderDebugInfo100Structure,false);
    local_44 = IVar2;
    local_48 = spv::Instruction::getResultId(pIStack_30);
    pmVar6 = std::
             map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             ::operator[](&this->debugId,&local_48);
    *pmVar6 = IVar2;
  }
  IVar2 = spv::Instruction::getResultId(pIStack_30);
  return IVar2;
}

Assistant:

Id Builder::makeStructType(const std::vector<Id>& members, const char* name, bool const compilerGenerated)
{
    // Don't look for previous one, because in the general case,
    // structs can be duplicated except for decorations.

    // not found, make it
    Instruction* type = new Instruction(getUniqueId(), NoType, OpTypeStruct);
    for (int op = 0; op < (int)members.size(); ++op)
        type->addIdOperand(members[op]);
    groupedTypes[OpTypeStruct].push_back(type);
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(type));
    module.mapInstruction(type);
    addName(type->getResultId(), name);

    if (emitNonSemanticShaderDebugInfo && !compilerGenerated)
    {
        auto const debugResultId = makeCompositeDebugType(members, name, NonSemanticShaderDebugInfo100Structure);
        debugId[type->getResultId()] = debugResultId;
    }

    return type->getResultId();
}